

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  int iVar1;
  bool bVar2;
  uint16_t local_24;
  uint16_t prev_and_exp;
  uint16_t prev_or_exp;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  while( true ) {
    exp_idx_00 = *exp_idx;
    local_24 = *exp_idx;
    iVar1 = reparse_equality_expr(exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
    while( true ) {
      iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_LOG,0);
      bVar2 = false;
      if (iVar1 == 0) {
        bVar2 = exp->tok_len[*exp_idx] == '\x03';
      }
      if (!bVar2) break;
      exp_repeat_push(exp,local_24,*exp_idx);
      *exp_idx = *exp_idx + 1;
      local_24 = *exp_idx;
      iVar1 = reparse_equality_expr(exp,exp_idx);
      if (iVar1 != 0) {
        return -1;
      }
    }
    iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_LOG,0);
    bVar2 = false;
    if (iVar1 == 0) {
      bVar2 = exp->tok_len[*exp_idx] == '\x02';
    }
    if (!bVar2) break;
    exp_repeat_push(exp,exp_idx_00,*exp_idx);
    *exp_idx = *exp_idx + 1;
  }
  return 0;
}

Assistant:

static int
reparse_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_or_exp, prev_and_exp;

    goto reparse_equality_expr;

    /* ('or' AndExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_LOG, 0) && (exp->tok_len[*exp_idx] == 2)) {
        exp_repeat_push(exp, prev_or_exp, *exp_idx);
        ++(*exp_idx);

reparse_equality_expr:
        prev_or_exp = *exp_idx;
        prev_and_exp = *exp_idx;

        /* EqualityExpr */
        if (reparse_equality_expr(exp, exp_idx)) {
            return -1;
        }

        /* ('and' EqualityExpr)* */
        while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_LOG, 0) && (exp->tok_len[*exp_idx] == 3)) {
            exp_repeat_push(exp, prev_and_exp, *exp_idx);
            ++(*exp_idx);

            prev_and_exp = *exp_idx;
            if (reparse_equality_expr(exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}